

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O0

void __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::sort(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
       *this)

{
  iterator pvVar1;
  iterator pvVar2;
  sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
  *this_local;
  
  pvVar1 = vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
           ::begin(&this->data_vec_);
  pvVar2 = vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
           ::end(&this->data_vec_);
  std::
  sort<std::pair<std::__cxx11::string,std::__cxx11::string>*,estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>
            (pvVar1,pvVar2);
  this->is_sorted_ = true;
  return;
}

Assistant:

void sort()
    {
        std::sort(data_vec_.begin(), data_vec_.end(), comperator_);
        is_sorted_ = true;
    }